

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkiter.cpp
# Opt level: O1

void __thiscall
icu_63::ICUBreakIteratorService::ICUBreakIteratorService(ICUBreakIteratorService *this)

{
  ICUResourceBundleFactory *this_00;
  UnicodeString *dname;
  UErrorCode status;
  ConstChar16Ptr local_70;
  char16_t *local_68;
  UnicodeString local_58;
  
  local_70.p_ = L"Break Iterator";
  icu_63::UnicodeString::UnicodeString(&local_58,'\x01',&local_70,0xe);
  dname = &local_58;
  ICULocaleService::ICULocaleService(&this->super_ICULocaleService,dname);
  icu_63::UnicodeString::~UnicodeString(&local_58);
  local_68 = local_70.p_;
  (this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier =
       (_func_int **)&PTR__ICUBreakIteratorService_00480358;
  local_58.super_Replaceable.super_UObject._vptr_UObject._0_4_ = 0;
  this_00 = (ICUResourceBundleFactory *)UMemory::operator_new((UMemory *)0x90,(size_t)dname);
  if (this_00 == (ICUResourceBundleFactory *)0x0) {
    this_00 = (ICUResourceBundleFactory *)0x0;
  }
  else {
    memset(this_00,0,0x90);
    ICUResourceBundleFactory::ICUResourceBundleFactory(this_00);
    (this_00->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject =
         (_func_int **)&PTR__ICUBreakIteratorFactory_004802e8;
  }
  (*(this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier[9])
            (this,this_00,&local_58);
  return;
}

Assistant:

ICUBreakIteratorService()
        : ICULocaleService(UNICODE_STRING("Break Iterator", 14))
    {
        UErrorCode status = U_ZERO_ERROR;
        registerFactory(new ICUBreakIteratorFactory(), status);
    }